

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_5::ParallelFlatHashSet_ForEach_Test::~ParallelFlatHashSet_ForEach_Test
          (ParallelFlatHashSet_ForEach_Test *this)

{
  ParallelFlatHashSet_ForEach_Test *this_local;
  
  ~ParallelFlatHashSet_ForEach_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(THIS_TEST_NAME, ForEach) {
    // -------------
    // test for_each
    // -------------
    using Set = phmap::THIS_HASH_SET<Entry>;
    Set m = { {1, 7}, {2, 8}, {5, 11} };

    int counter = 0;
    m.for_each([&counter](const Set::value_type &v) {
            ++counter;
            EXPECT_EQ(v.key + 6, v.value);
        });
    EXPECT_EQ(counter, 3);
}